

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O2

void CVmPack::skip_group_mods(CVmPackPos *p,CVmPackType *gt)

{
  wchar_t wVar1;
  wchar_t close_paren;
  
  wVar1 = CVmPackPos::getch(p);
  if (wVar1 == L'(') {
    close_paren = L')';
  }
  else if (wVar1 == L'[') {
    close_paren = L']';
  }
  else {
    close_paren = L'}';
    if (wVar1 != L'{') {
      close_paren = L'\0';
    }
  }
  CVmPackPos::inc(p);
  skip_group(p,close_paren);
  CVmPackPos::inc(p);
  parse_mods(p,gt);
  return;
}

Assistant:

void CVmPack::skip_group_mods(CVmPackPos *p, CVmPackType *gt)
{
    /* note the close paren type we're looking for */
    wchar_t c = p->getch();
    wchar_t close_paren = (c == '(' ? ')' :
                           c == '[' ? ']' :
                           c == '{' ? '}' :
                           0);

    /* skip to the close paren */
    p->inc();
    skip_group(p, close_paren);

    /* skip the close paren */
    p->inc();

    /* parse the group modifiers */
    parse_mods(p, gt);
}